

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontTrueType.cpp
# Opt level: O2

EStatusCode __thiscall
WrittenFontTrueType::WriteState
          (WrittenFontTrueType *this,ObjectsContext *inStateWriter,ObjectIDType inObjectID)

{
  EStatusCode EVar1;
  DictionaryContext *this_00;
  allocator<char> local_39;
  string local_38;
  
  EVar1 = ObjectsContext::StartNewIndirectObject(inStateWriter,inObjectID);
  if (EVar1 == eSuccess) {
    this_00 = ObjectsContext::StartDictionary(inStateWriter);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Type",&local_39);
    DictionaryContext::WriteKey(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"WrittenFontTrueType",&local_39);
    DictionaryContext::WriteNameValue(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    EVar1 = AbstractWrittenFont::WriteStateInDictionary
                      (&this->super_AbstractWrittenFont,inStateWriter,this_00);
    if (EVar1 == eSuccess) {
      ObjectsContext::EndDictionary(inStateWriter,this_00);
      ObjectsContext::EndIndirectObject(inStateWriter);
      EVar1 = AbstractWrittenFont::WriteStateAfterDictionary
                        (&this->super_AbstractWrittenFont,inStateWriter);
    }
  }
  return EVar1;
}

Assistant:

EStatusCode WrittenFontTrueType::WriteState(ObjectsContext* inStateWriter,ObjectIDType inObjectID)
{
	EStatusCode status = inStateWriter->StartNewIndirectObject(inObjectID);
	if(status != PDFHummus::eSuccess)
		return status;

	DictionaryContext* writtenFontDictionary = inStateWriter->StartDictionary();

	writtenFontDictionary->WriteKey("Type");
	writtenFontDictionary->WriteNameValue("WrittenFontTrueType");

	status = AbstractWrittenFont::WriteStateInDictionary(inStateWriter,writtenFontDictionary);
	if(PDFHummus::eSuccess == status)
	{
		inStateWriter->EndDictionary(writtenFontDictionary);
		inStateWriter->EndIndirectObject();

		status = AbstractWrittenFont::WriteStateAfterDictionary(inStateWriter);
	}
	return status;
}